

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitExecAllocator.c
# Opt level: O0

void * alloc_chunk(sljit_uw size)

{
  undefined8 local_28;
  int flags;
  void *retval;
  sljit_uw size_local;
  
  local_28 = mmap((void *)0x0,size,7,0x22,-1,0);
  if (local_28 == (void *)0xffffffffffffffff) {
    local_28 = (void *)0x0;
  }
  return local_28;
}

Assistant:

static SLJIT_INLINE void* alloc_chunk(sljit_uw size)
{
	void *retval;

#ifdef MAP_ANON

	int flags = MAP_PRIVATE | MAP_ANON;

#ifdef MAP_JIT
	flags |= MAP_JIT;
#endif

	retval = mmap(NULL, size, PROT_READ | PROT_WRITE | PROT_EXEC, flags, -1, 0);
#else
	if (dev_zero < 0) {
		if (open_dev_zero())
			return NULL;
	}
	retval = mmap(NULL, size, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE, dev_zero, 0);
#endif

	return (retval != MAP_FAILED) ? retval : NULL;
}